

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

seconds32 __thiscall libtorrent::aux::torrent::seeding_time(torrent *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  rep_conflict rVar3;
  time_point tVar4;
  
  bVar2 = is_seed(this);
  if ((bVar2) && (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0)) {
    tVar4 = time_now();
    auVar1 = SEXT816((long)tVar4.__d.__r + (long)(this->m_became_seed).__d.__r * -1000000000) *
             SEXT816(0x112e0be826d694b3);
    rVar3 = ((int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f)) + (this->m_seeding_time).__r;
  }
  else {
    rVar3 = (this->m_seeding_time).__r;
  }
  return (seconds32)rVar3;
}

Assistant:

seconds32 torrent::seeding_time() const
	{
		if(!is_seed() || is_paused())
			return m_seeding_time;
		// m_seeding_time does not account for the current "session", just the
		// time before we last started this torrent. To get the current time, we
		// need to add the time since we started it
		return m_seeding_time + duration_cast<seconds32>(
			aux::time_now() - m_became_seed);
	}